

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

shared_ptr<const_Map_Item> __thiscall Map::GetItem(Map *this,short uid)

{
  short in_DX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  long *plVar1;
  long *plVar2;
  shared_ptr<const_Map_Item> sVar3;
  shared_ptr<Map_Item> item;
  __shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  plVar2 = (long *)(CONCAT62(in_register_00000032,uid) + 0x68);
  plVar1 = plVar2;
  do {
    plVar1 = (long *)*plVar1;
    if (plVar1 == plVar2) {
      this->world = (World *)0x0;
      local_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this->id = 0;
      this->rid[0] = '\0';
      this->rid[1] = '\0';
      this->rid[2] = '\0';
      this->rid[3] = '\0';
      this->pk = false;
      this->field_0xf = 0;
      local_40._M_ptr = (element_type *)0x0;
LAB_0017c05f:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      sVar3.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar3.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<const_Map_Item>)
             sVar3.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(plVar1 + 2));
    if ((local_40._M_ptr)->uid == in_DX) {
      std::__shared_ptr<Map_Item_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Map_Item,void>
                ((__shared_ptr<Map_Item_const,(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
      goto LAB_0017c05f;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  } while( true );
}

Assistant:

std::shared_ptr<const Map_Item> Map::GetItem(short uid) const
{
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == uid)
		{
			return item;
		}
	}

	return std::shared_ptr<Map_Item>();
}